

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O1

int set_directory_record
              (uchar *p,size_t n,isoent *isoent,iso9660_conflict *iso9660,dir_rec_type t,
              vdd_type vdd_type)

{
  int *piVar1;
  extr_rec *peVar2;
  dir_rec_type dVar3;
  mode_t mVar4;
  uint uVar5;
  uint32_t uVar6;
  int iVar7;
  wchar_t wVar8;
  isoent *piVar9;
  time_t tVar10;
  la_int64_t lVar11;
  la_int64_t lVar12;
  content_conflict *pcVar13;
  time_t tVar14;
  dev_t dVar15;
  uchar uVar16;
  isofile *piVar17;
  ulong uVar18;
  byte bVar19;
  byte bVar20;
  uchar uVar21;
  uint32_t *puVar22;
  int64_t iVar23;
  byte *pbVar24;
  bool bVar25;
  int iVar26;
  long lVar27;
  byte *pbVar28;
  uchar uVar29;
  byte *pbVar30;
  uchar uVar31;
  byte *pbVar32;
  uchar *puVar33;
  byte bVar34;
  size_t __n;
  ulong uVar35;
  char *__src;
  uchar *puVar36;
  size_t __n_00;
  ctl_extr_rec ctl;
  byte local_a9;
  ctl_extr_rec local_a8;
  dir_rec_type local_6c;
  isofile *local_68;
  isoent *local_60;
  iso9660_conflict *local_58;
  isoent *local_50;
  isoent *local_48;
  isoent *local_40;
  uchar *local_38;
  
  local_58 = iso9660;
  if (p != (uchar *)0x0) {
    lVar27 = 0x98;
    if (t < DIR_REC_NORMAL) {
      lVar27 = (ulong)t * 4 + 0x8c;
    }
    if (n < (ulong)(long)*(int *)((long)(isoent->rbnode).rb_nodes + lVar27)) {
      return 0;
    }
  }
  __n = 1;
  if ((t == DIR_REC_NORMAL) && (isoent->identifier != (char *)0x0)) {
    __n = (size_t)isoent->id_len;
  }
  local_6c = t;
  local_60 = isoent;
  if (p == (uchar *)0x0) {
    puVar36 = (uchar *)0x0;
  }
  else {
    piVar9 = isoent;
    if (t == DIR_REC_PARENT) {
      piVar9 = isoent->parent;
    }
    piVar17 = isoent->file->hardlink_target;
    if (piVar17 == (isofile *)0x0) {
      piVar17 = isoent->file;
    }
    uVar29 = '\x02';
    if ((piVar9->field_0xe8 & 2) == 0) {
      uVar29 = (piVar17->cur_content->next != (content_conflict *)0x0) << 7;
    }
    p[1] = '\0';
    if ((piVar9->field_0xe8 & 2) == 0) {
      puVar22 = &piVar17->cur_content->location;
    }
    else {
      puVar22 = &piVar9->dir_location;
    }
    uVar6 = *puVar22;
    p[2] = (uchar)uVar6;
    uVar16 = (uchar)(uVar6 >> 8);
    p[3] = uVar16;
    uVar21 = (uchar)(uVar6 >> 0x10);
    p[4] = uVar21;
    uVar31 = (uchar)(uVar6 >> 0x18);
    p[5] = uVar31;
    p[6] = uVar31;
    p[7] = uVar21;
    p[8] = uVar16;
    p[9] = (uchar)uVar6;
    if ((piVar9->field_0xe8 & 2) == 0) {
      iVar23 = piVar17->cur_content->size;
      p[10] = (uchar)iVar23;
      uVar16 = (uchar)((ulong)iVar23 >> 8);
      p[0xb] = uVar16;
      uVar21 = (uchar)((ulong)iVar23 >> 0x10);
      p[0xc] = uVar21;
      uVar31 = (uchar)((ulong)iVar23 >> 0x18);
    }
    else {
      uVar5 = piVar9->dir_block;
      p[10] = '\0';
      uVar16 = (char)uVar5 * '\b';
      p[0xb] = uVar16;
      uVar21 = (uchar)(uVar5 >> 5);
      p[0xc] = uVar21;
      uVar31 = (uchar)(uVar5 >> 0xd);
      iVar23 = 0;
    }
    puVar36 = p + -1;
    p[0xd] = uVar31;
    p[0xe] = uVar31;
    p[0xf] = uVar21;
    p[0x10] = uVar16;
    p[0x11] = (uchar)iVar23;
    tVar10 = archive_entry_mtime(piVar9->file->entry);
    set_time_915(p + 0x12,tVar10);
    isoent = local_60;
    t = local_6c;
    p[0x19] = uVar29;
    p[0x1a] = '\0';
    p[0x1b] = '\0';
    iVar26 = local_58->volume_sequence_number;
    uVar29 = (uchar)iVar26;
    p[0x1c] = uVar29;
    uVar16 = (uchar)((uint)iVar26 >> 8);
    p[0x1d] = uVar16;
    p[0x1e] = uVar16;
    p[0x1f] = uVar29;
    p[0x20] = (uchar)__n;
    if (local_6c < DIR_REC_PARENT) {
      p[0x21] = '\0';
    }
    else if (local_6c == DIR_REC_PARENT) {
      p[0x21] = '\x01';
    }
    else if (local_60->identifier == (char *)0x0) {
      p[0x21] = '\0';
    }
    else {
      memcpy(p + 0x21,local_60->identifier,__n);
    }
  }
  uVar35 = __n + 0x21;
  if (((uVar35 & 1) != 0) && (uVar35 = __n + 0x22, p != (uchar *)0x0)) {
    puVar36[uVar35] = '\0';
  }
  local_a8.dr_len = (int)uVar35;
  if (t == DIR_REC_VD) {
    if (p == (uchar *)0x0) {
      (isoent->dr_len).vd = local_a8.dr_len;
      return local_a8.dr_len;
    }
  }
  else {
    if ((vdd_type != VDD_JOLIET) && (((uint)local_58->opt & 0x1800000) != 0)) {
      puVar33 = puVar36 + local_a8.dr_len;
      if (puVar36 == (uchar *)0x0) {
        puVar33 = (uchar *)0x0;
      }
      local_a8.bp = puVar36;
      local_a8.use_extr = 0;
      local_a8.isoent = isoent;
      local_a8.ce_ptr = (uchar *)0x0;
      local_a8.limit = 0xe2;
      if (t == DIR_REC_PARENT) {
        local_40 = isoent->rr_parent;
        local_48 = isoent->parent;
        piVar9 = local_40;
        if (local_40 == (isoent *)0x0) {
          piVar9 = isoent->parent;
        }
      }
      else {
        local_40 = (isoent *)0x0;
        local_48 = isoent;
        piVar9 = isoent;
      }
      piVar17 = piVar9->file;
      local_a8.cur_len = local_a8.dr_len;
      if (t == DIR_REC_NORMAL) {
        mVar4 = archive_entry_filetype(piVar17->entry);
        bVar19 = (piVar9->rr_child != (isoent *)0x0) << 4 |
                 (piVar9->rr_parent != (isoent *)0x0) << 6 | (mVar4 == 0xa000) << 2;
        bVar20 = bVar19 | 0x89;
        mVar4 = archive_entry_filetype(piVar17->entry);
        if ((mVar4 == 0x2000) || (mVar4 = archive_entry_filetype(piVar17->entry), mVar4 == 0x6000))
        {
          bVar20 = bVar19 | 0x8b;
        }
      }
      else {
        bVar20 = (local_40 != (isoent *)0x0) << 5 | 0x81;
      }
      if ((t == DIR_REC_SELF) && (piVar9 == piVar9->parent)) {
        if (puVar33 == (uchar *)0x0) {
          puVar33 = (uchar *)0x0;
        }
        else {
          puVar33[1] = 'S';
          puVar33[2] = 'P';
          puVar33[3] = '\a';
          puVar33[4] = '\x01';
          puVar33[5] = 0xbe;
          puVar33[6] = 0xef;
          puVar33[7] = '\0';
          puVar33 = puVar33 + 7;
        }
        if ((local_a8.use_extr != 0) &&
           (peVar2 = ((local_a8.isoent)->parent->extr_rec_list).current, peVar2 != (extr_rec *)0x0))
        {
          piVar1 = &peVar2->offset;
          *piVar1 = *piVar1 + 7;
        }
        local_a8.cur_len = local_a8.cur_len + 7;
      }
      if (local_a8.limit - local_a8.cur_len < 5) {
        puVar33 = extra_next_record(&local_a8,5);
      }
      if (puVar33 == (uchar *)0x0) {
        puVar33 = (uchar *)0x0;
      }
      else {
        puVar33[1] = 'R';
        puVar33[2] = 'R';
        puVar33[3] = '\x05';
        puVar33[4] = '\x01';
        puVar33[5] = bVar20;
        puVar33 = puVar33 + 5;
      }
      if ((local_a8.use_extr != 0) &&
         (peVar2 = ((local_a8.isoent)->parent->extr_rec_list).current, peVar2 != (extr_rec *)0x0)) {
        piVar1 = &peVar2->offset;
        *piVar1 = *piVar1 + 5;
      }
      local_a8.cur_len = local_a8.cur_len + 5;
      local_50 = piVar9;
      local_68 = piVar17;
      if ((bVar20 & 8) != 0) {
        __src = (piVar17->basename).s;
        __n_00 = (piVar17->basename).length;
        if (local_a8.limit - local_a8.cur_len < 6) {
          puVar33 = extra_next_record(&local_a8,6);
        }
        if (puVar33 != (uchar *)0x0) {
          puVar33[1] = 'N';
          puVar33[2] = 'M';
          puVar33[4] = '\x01';
        }
        uVar5 = local_a8.limit - local_a8.cur_len;
        if (0xfe < (uint)(local_a8.limit - local_a8.cur_len)) {
          uVar5 = 0xff;
        }
        uVar35 = (ulong)uVar5;
        if (uVar35 < __n_00 + 5) {
          do {
            if (puVar33 == (uchar *)0x0) {
              puVar33 = (uchar *)0x0;
            }
            else {
              puVar33[3] = (uchar)uVar35;
              puVar33[5] = '\x01';
              memcpy(puVar33 + 6,__src,(long)((uVar35 << 0x20) + -0x500000000) >> 0x20);
              puVar33 = puVar33 + uVar35;
            }
            if ((local_a8.use_extr != 0) &&
               (peVar2 = ((local_a8.isoent)->parent->extr_rec_list).current,
               peVar2 != (extr_rec *)0x0)) {
              piVar1 = &peVar2->offset;
              *piVar1 = *piVar1 + (int)uVar35;
            }
            local_a8.cur_len = local_a8.cur_len + (int)uVar35;
            uVar18 = uVar35;
            if (local_a8.limit - local_a8.cur_len < 6) {
              puVar33 = extra_next_record(&local_a8,6);
              uVar18 = (ulong)(uint)(local_a8.limit - local_a8.cur_len);
              if (0xfe < (uint)(local_a8.limit - local_a8.cur_len)) {
                uVar18 = 0xff;
              }
            }
            if (puVar33 != (uchar *)0x0) {
              puVar33[1] = 'N';
              puVar33[2] = 'M';
              puVar33[4] = '\x01';
            }
            lVar27 = (long)((uVar35 << 0x20) + -0x500000000) >> 0x20;
            __n_00 = __n_00 - lVar27;
            __src = __src + lVar27;
            uVar35 = uVar18;
          } while (uVar18 < __n_00 + 5);
        }
        iVar26 = (int)__n_00 + 5;
        if (puVar33 == (uchar *)0x0) {
          puVar33 = (uchar *)0x0;
        }
        else {
          puVar33[3] = (uchar)iVar26;
          puVar33[5] = '\0';
          memcpy(puVar33 + 6,__src,__n_00);
          puVar33 = puVar33 + iVar26;
        }
        if ((local_a8.use_extr != 0) &&
           (peVar2 = ((local_a8.isoent)->parent->extr_rec_list).current, peVar2 != (extr_rec *)0x0))
        {
          piVar1 = &peVar2->offset;
          *piVar1 = *piVar1 + iVar26;
        }
        local_a8.cur_len = local_a8.cur_len + iVar26;
      }
      piVar17 = local_68;
      if ((bVar20 & 1) != 0) {
        if (local_a8.limit - local_a8.cur_len < 0x2c) {
          puVar33 = extra_next_record(&local_a8,0x2c);
        }
        if (puVar33 == (uchar *)0x0) {
          puVar33 = (uchar *)0x0;
        }
        else {
          mVar4 = archive_entry_mode(piVar17->entry);
          lVar11 = archive_entry_uid(piVar17->entry);
          lVar12 = archive_entry_gid(piVar17->entry);
          piVar17 = local_68;
          if (((uint)local_58->opt & 0x1800000) == 0x1000000) {
            uVar5 = 0x16d;
            if ((mVar4 & 0x49) == 0) {
              uVar5 = 0x124;
            }
            mVar4 = mVar4 & 0xfffff049 | uVar5;
          }
          puVar33[1] = 'P';
          puVar33[2] = 'X';
          puVar33[3] = ',';
          puVar33[4] = '\x01';
          puVar33[5] = (uchar)mVar4;
          uVar29 = (uchar)(mVar4 >> 8);
          puVar33[6] = uVar29;
          uVar16 = (uchar)(mVar4 >> 0x10);
          puVar33[7] = uVar16;
          uVar21 = (uchar)(mVar4 >> 0x18);
          puVar33[8] = uVar21;
          puVar33[9] = uVar21;
          puVar33[10] = uVar16;
          puVar33[0xb] = uVar29;
          puVar33[0xc] = (uchar)mVar4;
          uVar5 = archive_entry_nlink(local_68->entry);
          puVar33[0xd] = (uchar)uVar5;
          uVar29 = (uchar)(uVar5 >> 8);
          puVar33[0xe] = uVar29;
          uVar16 = (uchar)(uVar5 >> 0x10);
          puVar33[0xf] = uVar16;
          uVar21 = (uchar)(uVar5 >> 0x18);
          puVar33[0x10] = uVar21;
          puVar33[0x11] = uVar21;
          puVar33[0x12] = uVar16;
          puVar33[0x13] = uVar29;
          puVar33[0x14] = (uchar)uVar5;
          puVar33[0x15] = (uchar)lVar11;
          uVar29 = (uchar)((ulong)lVar11 >> 8);
          puVar33[0x16] = uVar29;
          uVar16 = (uchar)((ulong)lVar11 >> 0x10);
          puVar33[0x17] = uVar16;
          uVar21 = (uchar)((ulong)lVar11 >> 0x18);
          puVar33[0x18] = uVar21;
          puVar33[0x19] = uVar21;
          puVar33[0x1a] = uVar16;
          puVar33[0x1b] = uVar29;
          puVar33[0x1c] = (uchar)lVar11;
          puVar33[0x1d] = (uchar)lVar12;
          uVar29 = (uchar)((ulong)lVar12 >> 8);
          puVar33[0x1e] = uVar29;
          uVar16 = (uchar)((ulong)lVar12 >> 0x10);
          puVar33[0x1f] = uVar16;
          uVar21 = (uchar)((ulong)lVar12 >> 0x18);
          puVar33[0x20] = uVar21;
          puVar33[0x21] = uVar21;
          puVar33[0x22] = uVar16;
          puVar33[0x23] = uVar29;
          puVar33[0x24] = (uchar)lVar12;
          if ((local_48->field_0xe8 & 2) == 0) {
            if (piVar17->hardlink_target == (isofile *)0x0) {
              pcVar13 = piVar17->cur_content;
            }
            else {
              pcVar13 = piVar17->hardlink_target->cur_content;
            }
            uVar6 = pcVar13->location;
          }
          else {
            uVar6 = local_48->dir_location;
          }
          puVar33[0x25] = (uchar)uVar6;
          uVar29 = (uchar)(uVar6 >> 8);
          puVar33[0x26] = uVar29;
          uVar16 = (uchar)(uVar6 >> 0x10);
          puVar33[0x27] = uVar16;
          uVar21 = (uchar)(uVar6 >> 0x18);
          puVar33[0x28] = uVar21;
          puVar33[0x29] = uVar21;
          puVar33[0x2a] = uVar16;
          puVar33[0x2b] = uVar29;
          puVar33[0x2c] = (uchar)uVar6;
          puVar33 = puVar33 + 0x2c;
        }
        if ((local_a8.use_extr != 0) &&
           (peVar2 = ((local_a8.isoent)->parent->extr_rec_list).current, peVar2 != (extr_rec *)0x0))
        {
          piVar1 = &peVar2->offset;
          *piVar1 = *piVar1 + 0x2c;
        }
        local_a8.cur_len = local_a8.cur_len + 0x2c;
      }
      if ((bVar20 & 4) != 0) {
        if (local_a8.limit - local_a8.cur_len < 7) {
          puVar33 = extra_next_record(&local_a8,7);
        }
        pbVar28 = (byte *)(piVar17->symlink).s;
        if (puVar33 != (uchar *)0x0) {
          puVar33[1] = 'S';
          puVar33[2] = 'L';
          puVar33[4] = '\x01';
        }
        bVar19 = 0;
        do {
          iVar7 = local_a8.limit - local_a8.cur_len;
          iVar26 = 0xff;
          if (iVar7 < 0xff) {
            iVar26 = iVar7;
          }
          local_a9 = 0;
          bVar34 = *pbVar28;
          if (iVar7 < 0xc || bVar34 == 0) {
            iVar7 = 5;
            pbVar24 = (byte *)0x0;
          }
          else {
            pbVar30 = puVar33 + 6;
            if (puVar33 == (uchar *)0x0) {
              pbVar30 = (byte *)0x0;
            }
            iVar7 = 0;
            pbVar32 = (byte *)0x0;
            pbVar24 = (byte *)0x0;
            do {
              if (bVar34 == 0x2f && bVar19 == 0) {
                if (pbVar30 == (byte *)0x0) {
                  pbVar32 = (byte *)0x0;
                }
                else {
                  pbVar30[0] = 8;
                  pbVar30[1] = 0;
                  pbVar32 = pbVar30 + 2;
                  pbVar24 = pbVar30;
                }
                pbVar28 = pbVar28 + 1;
                bVar19 = 0x2f;
                pbVar30 = pbVar32;
LAB_00400786:
                iVar7 = iVar7 + 2;
                pbVar32 = (byte *)0x0;
              }
              else {
                if ((((((bVar19 == 0x2f) || (bVar19 == 0)) && (bVar34 == 0x2e)) &&
                     (pbVar28[1] == 0x2e)) && ((pbVar28[2] == 0 || (pbVar28[2] == 0x2f)))) ||
                   (((bVar34 == 0x2f && ((pbVar28[1] == 0x2e && (pbVar28[2] == 0x2e)))) &&
                    ((pbVar28[3] == 0x2f || (pbVar28[3] == 0)))))) {
                  if (pbVar30 == (byte *)0x0) {
                    pbVar32 = (byte *)0x0;
                  }
                  else {
                    pbVar30[0] = 4;
                    pbVar30[1] = 0;
                    pbVar32 = pbVar30 + 2;
                    pbVar24 = pbVar30;
                  }
                  lVar27 = (ulong)(*pbVar28 == 0x2f) + 2;
LAB_00400783:
                  pbVar28 = pbVar28 + lVar27;
                  bVar19 = 0x2e;
                  pbVar30 = pbVar32;
                  goto LAB_00400786;
                }
                if (((((bVar19 == 0x2f) || (bVar19 == 0)) && (bVar34 == 0x2e)) &&
                    ((pbVar28[1] == 0 || (pbVar28[1] == 0x2f)))) ||
                   (((bVar34 == 0x2f && (pbVar28[1] == 0x2e)) &&
                    ((pbVar28[2] == 0x2f || (pbVar28[2] == 0)))))) {
                  if (pbVar30 == (byte *)0x0) {
                    pbVar32 = (byte *)0x0;
                  }
                  else {
                    pbVar30[0] = 2;
                    pbVar30[1] = 0;
                    pbVar32 = pbVar30 + 2;
                    pbVar24 = pbVar30;
                  }
                  lVar27 = (ulong)(*pbVar28 == 0x2f) + 1;
                  goto LAB_00400783;
                }
                if ((bVar34 == 0x2f) || (pbVar32 == (byte *)0x0)) {
                  if (pbVar30 == (byte *)0x0) {
                    pbVar30 = (byte *)0x0;
                    pbVar32 = &local_a9;
                  }
                  else {
                    pbVar30[0] = 0;
                    pbVar30[1] = 0;
                    pbVar24 = pbVar30;
                    pbVar32 = pbVar30 + 1;
                    pbVar30 = pbVar30 + 2;
                  }
                  iVar7 = iVar7 + 2;
                  if (*pbVar28 != 0x2f) goto LAB_00400753;
                  pbVar28 = pbVar28 + 1;
                  bVar19 = 0x2f;
                }
                else {
LAB_00400753:
                  bVar19 = *pbVar28;
                  if (pbVar30 == (byte *)0x0) {
                    pbVar30 = (byte *)0x0;
                  }
                  else {
                    *pbVar30 = bVar19;
                    pbVar30 = pbVar30 + 1;
                    *pbVar32 = *pbVar32 + 1;
                  }
                  pbVar28 = pbVar28 + 1;
                  iVar7 = iVar7 + 1;
                }
              }
              bVar34 = *pbVar28;
            } while ((bVar34 != 0) && (iVar7 + 0xb < iVar26));
            iVar7 = iVar7 + 5;
          }
          if (bVar34 == 0) {
            if (puVar33 == (uchar *)0x0) {
              puVar33 = (uchar *)0x0;
            }
            else {
              puVar33[3] = (uchar)iVar7;
              puVar33[5] = '\0';
              puVar33 = puVar33 + iVar7;
            }
            if ((local_a8.use_extr != 0) &&
               (peVar2 = ((local_a8.isoent)->parent->extr_rec_list).current,
               peVar2 != (extr_rec *)0x0)) {
              piVar1 = &peVar2->offset;
              *piVar1 = *piVar1 + iVar7;
            }
            local_a8.cur_len = local_a8.cur_len + iVar7;
          }
          else {
            if (puVar33 == (uchar *)0x0) {
              puVar33 = (uchar *)0x0;
            }
            else {
              *pbVar24 = *pbVar24 | 1;
              puVar33[3] = (uchar)iVar7;
              puVar33[5] = '\x01';
              puVar33 = puVar33 + iVar7;
            }
            if ((local_a8.use_extr != 0) &&
               (peVar2 = ((local_a8.isoent)->parent->extr_rec_list).current,
               peVar2 != (extr_rec *)0x0)) {
              piVar1 = &peVar2->offset;
              *piVar1 = *piVar1 + iVar7;
            }
            local_a8.cur_len = iVar7 + local_a8.cur_len;
            if (local_a8.limit - local_a8.cur_len < 0xb) {
              puVar33 = extra_next_record(&local_a8,0xb);
            }
            if (puVar33 != (uchar *)0x0) {
              puVar33[1] = 'S';
              puVar33[2] = 'L';
              puVar33[4] = '\x01';
            }
          }
        } while (bVar34 != 0);
      }
      piVar17 = local_68;
      wVar8 = archive_entry_birthtime_is_set(local_68->entry);
      local_38 = p;
      if (wVar8 == L'\0') {
        bVar25 = false;
        iVar26 = 5;
      }
      else {
        tVar10 = archive_entry_birthtime(piVar17->entry);
        tVar14 = archive_entry_mtime(piVar17->entry);
        bVar25 = tVar10 <= tVar14;
        iVar26 = 5;
        if (tVar10 <= tVar14) {
          iVar26 = 0xc;
        }
      }
      wVar8 = archive_entry_mtime_is_set(piVar17->entry);
      iVar7 = iVar26 + 7;
      bVar19 = bVar25 + 2;
      if (wVar8 == L'\0') {
        iVar7 = iVar26;
        bVar19 = bVar25;
      }
      wVar8 = archive_entry_atime_is_set(piVar17->entry);
      bVar34 = bVar19 + 4;
      iVar26 = iVar7 + 7;
      if (wVar8 == L'\0') {
        bVar34 = bVar19;
        iVar26 = iVar7;
      }
      wVar8 = archive_entry_ctime_is_set(piVar17->entry);
      bVar19 = bVar34 | 8;
      iVar7 = iVar26 + 7;
      if (wVar8 == L'\0') {
        bVar19 = bVar34;
        iVar7 = iVar26;
      }
      if (local_a8.limit - local_a8.cur_len < iVar7) {
        puVar33 = extra_next_record(&local_a8,iVar7);
      }
      p = local_38;
      piVar17 = local_68;
      if (puVar33 == (uchar *)0x0) {
        puVar33 = (uchar *)0x0;
      }
      else {
        puVar33[1] = 'T';
        puVar33[2] = 'F';
        puVar33[3] = (uchar)iVar7;
        puVar33[4] = '\x01';
        puVar33[5] = bVar19;
        if ((bVar19 & 1) == 0) {
          puVar33 = puVar33 + 5;
        }
        else {
          tVar10 = archive_entry_birthtime(local_68->entry);
          set_time_915(puVar33 + 6,tVar10);
          puVar33 = puVar33 + 0xc;
        }
        if ((bVar19 & 2) != 0) {
          tVar10 = archive_entry_mtime(piVar17->entry);
          set_time_915(puVar33 + 1,tVar10);
          puVar33 = puVar33 + 7;
        }
        if ((bVar19 & 4) != 0) {
          tVar10 = archive_entry_atime(piVar17->entry);
          set_time_915(puVar33 + 1,tVar10);
          puVar33 = puVar33 + 7;
        }
        if ((bVar19 & 8) != 0) {
          tVar10 = archive_entry_ctime(piVar17->entry);
          set_time_915(puVar33 + 1,tVar10);
          puVar33 = puVar33 + 7;
        }
      }
      isoent = local_60;
      dVar3 = local_6c;
      if ((local_a8.use_extr != 0) &&
         (peVar2 = ((local_a8.isoent)->parent->extr_rec_list).current, peVar2 != (extr_rec *)0x0)) {
        piVar1 = &peVar2->offset;
        *piVar1 = *piVar1 + iVar7;
      }
      local_a8.cur_len = iVar7 + local_a8.cur_len;
      if ((bVar20 & 0x40) != 0) {
        if (local_a8.limit - local_a8.cur_len < 4) {
          puVar33 = extra_next_record(&local_a8,4);
        }
        if (puVar33 == (uchar *)0x0) {
          puVar33 = (uchar *)0x0;
        }
        else {
          builtin_memcpy(puVar33 + 1,"RE\x04\x01",4);
          puVar33 = puVar33 + 4;
        }
        if ((local_a8.use_extr != 0) &&
           (peVar2 = ((local_a8.isoent)->parent->extr_rec_list).current, peVar2 != (extr_rec *)0x0))
        {
          piVar1 = &peVar2->offset;
          *piVar1 = *piVar1 + 4;
        }
        local_a8.cur_len = local_a8.cur_len + 4;
      }
      piVar9 = local_50;
      if ((bVar20 & 0x20) != 0) {
        if (local_a8.limit - local_a8.cur_len < 0xc) {
          puVar33 = extra_next_record(&local_a8,0xc);
        }
        if (puVar33 == (uchar *)0x0) {
          puVar33 = (uchar *)0x0;
        }
        else {
          puVar33[1] = 'P';
          puVar33[2] = 'L';
          puVar33[3] = '\f';
          puVar33[4] = '\x01';
          uVar6 = local_40->dir_location;
          puVar33[5] = (uchar)uVar6;
          uVar29 = (uchar)(uVar6 >> 8);
          puVar33[6] = uVar29;
          uVar16 = (uchar)(uVar6 >> 0x10);
          puVar33[7] = uVar16;
          uVar21 = (uchar)(uVar6 >> 0x18);
          puVar33[8] = uVar21;
          puVar33[9] = uVar21;
          puVar33[10] = uVar16;
          puVar33[0xb] = uVar29;
          puVar33[0xc] = (uchar)uVar6;
          puVar33 = puVar33 + 0xc;
        }
        if ((local_a8.use_extr != 0) &&
           (peVar2 = ((local_a8.isoent)->parent->extr_rec_list).current, peVar2 != (extr_rec *)0x0))
        {
          piVar1 = &peVar2->offset;
          *piVar1 = *piVar1 + 0xc;
        }
        local_a8.cur_len = local_a8.cur_len + 0xc;
      }
      if ((bVar20 & 0x10) != 0) {
        if (local_a8.limit - local_a8.cur_len < 0xc) {
          puVar33 = extra_next_record(&local_a8,0xc);
        }
        if (puVar33 == (uchar *)0x0) {
          puVar33 = (uchar *)0x0;
        }
        else {
          puVar33[1] = 'C';
          puVar33[2] = 'L';
          puVar33[3] = '\f';
          puVar33[4] = '\x01';
          uVar6 = piVar9->rr_child->dir_location;
          puVar33[5] = (uchar)uVar6;
          uVar29 = (uchar)(uVar6 >> 8);
          puVar33[6] = uVar29;
          uVar16 = (uchar)(uVar6 >> 0x10);
          puVar33[7] = uVar16;
          uVar21 = (uchar)(uVar6 >> 0x18);
          puVar33[8] = uVar21;
          puVar33[9] = uVar21;
          puVar33[10] = uVar16;
          puVar33[0xb] = uVar29;
          puVar33[0xc] = (uchar)uVar6;
          puVar33 = puVar33 + 0xc;
        }
        if ((local_a8.use_extr != 0) &&
           (peVar2 = ((local_a8.isoent)->parent->extr_rec_list).current, peVar2 != (extr_rec *)0x0))
        {
          piVar1 = &peVar2->offset;
          *piVar1 = *piVar1 + 0xc;
        }
        local_a8.cur_len = local_a8.cur_len + 0xc;
      }
      if ((bVar20 & 2) != 0) {
        if (local_a8.limit - local_a8.cur_len < 0x14) {
          puVar33 = extra_next_record(&local_a8,0x14);
        }
        if (puVar33 == (uchar *)0x0) {
          puVar33 = (uchar *)0x0;
        }
        else {
          puVar33[1] = 'P';
          puVar33[2] = 'N';
          puVar33[3] = '\x14';
          puVar33[4] = '\x01';
          dVar15 = archive_entry_rdev(piVar17->entry);
          uVar29 = (uchar)(dVar15 >> 0x20);
          puVar33[5] = uVar29;
          uVar16 = (uchar)(dVar15 >> 0x28);
          puVar33[6] = uVar16;
          uVar21 = (uchar)(dVar15 >> 0x30);
          puVar33[7] = uVar21;
          uVar31 = (uchar)(dVar15 >> 0x38);
          puVar33[8] = uVar31;
          puVar33[9] = uVar31;
          puVar33[10] = uVar21;
          puVar33[0xb] = uVar16;
          puVar33[0xc] = uVar29;
          puVar33[0xd] = (uchar)dVar15;
          uVar29 = (uchar)(dVar15 >> 8);
          puVar33[0xe] = uVar29;
          uVar16 = (uchar)(dVar15 >> 0x10);
          puVar33[0xf] = uVar16;
          uVar21 = (uchar)(dVar15 >> 0x18);
          puVar33[0x10] = uVar21;
          puVar33[0x11] = uVar21;
          puVar33[0x12] = uVar16;
          puVar33[0x13] = uVar29;
          puVar33[0x14] = (uchar)dVar15;
          puVar33 = puVar33 + 0x14;
        }
        if ((local_a8.use_extr != 0) &&
           (peVar2 = ((local_a8.isoent)->parent->extr_rec_list).current, peVar2 != (extr_rec *)0x0))
        {
          piVar1 = &peVar2->offset;
          *piVar1 = *piVar1 + 0x14;
        }
        local_a8.cur_len = local_a8.cur_len + 0x14;
      }
      if ((piVar17->zisofs).header_size != '\0') {
        if (local_a8.limit - local_a8.cur_len < 0x10) {
          puVar33 = extra_next_record(&local_a8,0x10);
        }
        if (puVar33 == (uchar *)0x0) {
          puVar33 = (uchar *)0x0;
        }
        else {
          puVar33[1] = 'Z';
          puVar33[2] = 'F';
          puVar33[3] = '\x10';
          puVar33[4] = '\x01';
          puVar33[5] = 'p';
          puVar33[6] = 'z';
          puVar33[7] = (piVar17->zisofs).header_size;
          puVar33[8] = (piVar17->zisofs).log2_bs;
          uVar6 = (piVar17->zisofs).uncompressed_size;
          puVar33[9] = (uchar)uVar6;
          uVar29 = (uchar)(uVar6 >> 8);
          puVar33[10] = uVar29;
          uVar16 = (uchar)(uVar6 >> 0x10);
          puVar33[0xb] = uVar16;
          uVar21 = (uchar)(uVar6 >> 0x18);
          puVar33[0xc] = uVar21;
          puVar33[0xd] = uVar21;
          puVar33[0xe] = uVar16;
          puVar33[0xf] = uVar29;
          puVar33[0x10] = (uchar)uVar6;
          puVar33 = puVar33 + 0x10;
        }
        if ((local_a8.use_extr != 0) &&
           (peVar2 = ((local_a8.isoent)->parent->extr_rec_list).current, peVar2 != (extr_rec *)0x0))
        {
          piVar1 = &peVar2->offset;
          *piVar1 = *piVar1 + 0x10;
        }
        local_a8.cur_len = local_a8.cur_len + 0x10;
      }
      if ((dVar3 == DIR_REC_SELF) && (piVar9 == piVar9->parent)) {
        if (puVar33 != (uchar *)0x0) {
          set_SUSP_CE(puVar33 + 1,local_58->location_rrip_er,0,0xed);
        }
        if ((local_a8.use_extr != 0) &&
           (peVar2 = ((local_a8.isoent)->parent->extr_rec_list).current, peVar2 != (extr_rec *)0x0))
        {
          piVar1 = &peVar2->offset;
          *piVar1 = *piVar1 + 0x1c;
        }
        local_a8.cur_len = local_a8.cur_len + 0x1c;
      }
      extra_close_record(&local_a8,0);
      t = local_6c;
    }
    if (p == (uchar *)0x0) {
      if (t == DIR_REC_NORMAL) {
        (isoent->dr_len).normal = local_a8.dr_len;
        return local_a8.dr_len;
      }
      if (t == DIR_REC_PARENT) {
        (isoent->dr_len).parent = local_a8.dr_len;
        return local_a8.dr_len;
      }
      (isoent->dr_len).self = local_a8.dr_len;
      return local_a8.dr_len;
    }
  }
  *p = (uchar)local_a8.dr_len;
  return local_a8.dr_len;
}

Assistant:

static int
set_directory_record(unsigned char *p, size_t n, struct isoent *isoent,
    struct iso9660 *iso9660, enum dir_rec_type t,
    enum vdd_type vdd_type)
{
	unsigned char *bp;
	size_t dr_len;
	size_t fi_len;

	if (p != NULL) {
		/*
		 * Check whether a write buffer size is less than the
		 * saved size which is needed to write this Directory
		 * Record.
		 */
		switch (t) {
		case DIR_REC_VD:
			dr_len = isoent->dr_len.vd; break;
		case DIR_REC_SELF:
			dr_len = isoent->dr_len.self; break;
		case DIR_REC_PARENT:
			dr_len = isoent->dr_len.parent; break;
		case DIR_REC_NORMAL:
		default:
			dr_len = isoent->dr_len.normal; break;
		}
		if (dr_len > n)
			return (0);/* Needs more buffer size. */
	}

	if (t == DIR_REC_NORMAL && isoent->identifier != NULL)
		fi_len = isoent->id_len;
	else
		fi_len = 1;

	if (p != NULL) {
		struct isoent *xisoent;
		struct isofile *file;
		unsigned char flag;

		if (t == DIR_REC_PARENT)
			xisoent = isoent->parent;
		else
			xisoent = isoent;
		file = isoent->file;
		if (file->hardlink_target != NULL)
			file = file->hardlink_target;
		/* Make a file flag. */
		if (xisoent->dir)
			flag = FILE_FLAG_DIRECTORY;
		else {
			if (file->cur_content->next != NULL)
				flag = FILE_FLAG_MULTI_EXTENT;
			else
				flag = 0;
		}

		bp = p -1;
		/* Extended Attribute Record Length */
		set_num_711(bp+2, 0);
		/* Location of Extent */
		if (xisoent->dir)
			set_num_733(bp+3, xisoent->dir_location);
		else
			set_num_733(bp+3, file->cur_content->location);
		/* Data Length */
		if (xisoent->dir)
			set_num_733(bp+11,
			    xisoent->dir_block * LOGICAL_BLOCK_SIZE);
		else
			set_num_733(bp+11, (uint32_t)file->cur_content->size);
		/* Recording Date and Time */
		/* NOTE:
		 *  If a file type is symbolic link, you are seeing this
		 *  field value is different from a value mkisofs makes.
		 *  libarchive uses lstat to get this one, but it
		 *  seems mkisofs uses stat to get.
		 */
		set_time_915(bp+19,
		    archive_entry_mtime(xisoent->file->entry));
		/* File Flags */
		bp[26] = flag;
		/* File Unit Size */
		set_num_711(bp+27, 0);
		/* Interleave Gap Size */
		set_num_711(bp+28, 0);
		/* Volume Sequence Number */
		set_num_723(bp+29, iso9660->volume_sequence_number);
		/* Length of File Identifier */
		set_num_711(bp+33, (unsigned char)fi_len);
		/* File Identifier */
		switch (t) {
		case DIR_REC_VD:
		case DIR_REC_SELF:
			set_num_711(bp+34, 0);
			break;
		case DIR_REC_PARENT:
			set_num_711(bp+34, 1);
			break;
		case DIR_REC_NORMAL:
			if (isoent->identifier != NULL)
				memcpy(bp+34, isoent->identifier, fi_len);
			else
				set_num_711(bp+34, 0);
			break;
		}
	} else
		bp = NULL;
	dr_len = 33 + fi_len;
	/* Padding Field */
	if (dr_len & 0x01) {
		dr_len ++;
		if (p != NULL)
			bp[dr_len] = 0;
	}

	/* Volume Descriptor does not record extension. */
	if (t == DIR_REC_VD) {
		if (p != NULL)
			/* Length of Directory Record */
			set_num_711(p, (unsigned char)dr_len);
		else
			isoent->dr_len.vd = (int)dr_len;
		return ((int)dr_len);
	}

	/* Rockridge */
	if (iso9660->opt.rr && vdd_type != VDD_JOLIET)
		dr_len = set_directory_record_rr(bp, (int)dr_len,
		    isoent, iso9660, t);

	if (p != NULL)
		/* Length of Directory Record */
		set_num_711(p, (unsigned char)dr_len);
	else {
		/*
		 * Save the size which is needed to write this
		 * Directory Record.
		 */
		switch (t) {
		case DIR_REC_VD:
			/* This case does not come, but compiler
			 * complains that DIR_REC_VD not handled
			 *  in switch ....  */
			break;
		case DIR_REC_SELF:
			isoent->dr_len.self = (int)dr_len; break;
		case DIR_REC_PARENT:
			isoent->dr_len.parent = (int)dr_len; break;
		case DIR_REC_NORMAL:
			isoent->dr_len.normal = (int)dr_len; break;
		}
	}

	return ((int)dr_len);
}